

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectator.cpp
# Opt level: O2

void CSpectator::ConKeySpectator(IResult *pResult,void *pUserData)

{
  long lVar1;
  int iVar2;
  
  lVar1 = *(long *)((long)pUserData + 8);
  if (*(char *)(lVar1 + 0x1628) == '\x01') {
    if ((*(int *)(*(long *)(lVar1 + 0x858) + 0x10) == 4) &&
       (iVar2 = (**(code **)(**(long **)(lVar1 + 0x880) + 0x50))(), iVar2 != 2)) {
      return;
    }
    iVar2 = (*pResult->_vptr_IResult[2])(pResult,0);
    *(bool *)((long)pUserData + 0x10) = iVar2 != 0;
  }
  return;
}

Assistant:

void CSpectator::ConKeySpectator(IConsole::IResult *pResult, void *pUserData)
{
	CSpectator *pSelf = (CSpectator *)pUserData;
	if(pSelf->m_pClient->m_Snap.m_SpecInfo.m_Active &&
		(pSelf->Client()->State() != IClient::STATE_DEMOPLAYBACK || pSelf->DemoPlayer()->GetDemoType() == IDemoPlayer::DEMOTYPE_SERVER))
		pSelf->m_Active = pResult->GetInteger(0) != 0;
}